

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXExporter::WriteAsciiSectionHeader(FBXExporter *this,string *title)

{
  ostream *poVar1;
  string local_218;
  stringstream local_1f8 [8];
  stringstream s;
  ostream local_1e8 [392];
  shared_ptr<Assimp::IOStream> local_60;
  undefined1 local_50 [8];
  StreamWriterLE outstream;
  string *title_local;
  FBXExporter *this_local;
  
  outstream.cursor = (size_t)title;
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&local_60,&this->outfile);
  StreamWriter<false,_false>::StreamWriter((StreamWriter<false,_false> *)local_50,&local_60,false);
  std::shared_ptr<Assimp::IOStream>::~shared_ptr(&local_60);
  std::__cxx11::stringstream::stringstream(local_1f8);
  poVar1 = std::operator<<(local_1e8,"\n\n; ");
  poVar1 = std::operator<<(poVar1,(string *)outstream.cursor);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(local_1e8,(string *)FBX::COMMENT_UNDERLINE_abi_cxx11_);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  StreamWriter<false,_false>::PutString((StreamWriter<false,_false> *)local_50,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::stringstream::~stringstream(local_1f8);
  StreamWriter<false,_false>::~StreamWriter((StreamWriter<false,_false> *)local_50);
  return;
}

Assistant:

void FBXExporter::WriteAsciiSectionHeader(const std::string& title)
{
    StreamWriterLE outstream(outfile);
    std::stringstream s;
    s << "\n\n; " << title << '\n';
    s << FBX::COMMENT_UNDERLINE << "\n";
    outstream.PutString(s.str());
}